

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_test.c
# Opt level: O0

void * thread_decode(void *arg)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  MPP_RET ret;
  RK_S64 t_e;
  RK_S64 t_s;
  MppApi *mpi;
  MppCtx ctx;
  MpiDecTestCmd *cmd;
  MpiDecLoopData *data;
  void *arg_local;
  
  lVar6 = *arg;
  uVar1 = *(undefined8 *)((long)arg + 8);
  lVar2 = *(long *)((long)arg + 0x10);
  memset((void *)((long)arg + 0x88),0,0x30);
  uVar4 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0x90) = uVar4;
  uVar4 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0xa8) = uVar4;
  lVar5 = mpp_time();
  if (*(int *)(lVar6 + 0x218) == 0) {
    if (((((*(uint *)(lVar6 + 0x204) & 0xf0000) == 0) &&
         ((*(uint *)(lVar6 + 0x204) & 0xfffff) < 0x14)) ||
        (((*(uint *)(lVar6 + 0x204) & 0xf0000) == 0x10000 &&
         ((*(uint *)(lVar6 + 0x204) & 0xfffff) < 0x10010)))) &&
       (iVar3 = (**(code **)(lVar2 + 0x70))(uVar1,0x31000a,lVar6 + 0x204), iVar3 != 0)) {
      _mpp_log_l(2,"mpi_dec_test","Failed to set output format 0x%x\n",0,
                 *(undefined4 *)(lVar6 + 0x204));
      return (void *)0x0;
    }
    while (*(int *)((long)arg + 0x1c) == 0) {
      dec_advanced((MpiDecLoopData *)arg);
    }
  }
  else {
    while (*(int *)((long)arg + 0x1c) == 0) {
      dec_simple((MpiDecLoopData *)arg);
    }
  }
  lVar6 = mpp_time();
  *(long *)((long)arg + 0x70) = lVar6 - lVar5;
  *(undefined4 *)((long)arg + 0x48) = *(undefined4 *)((long)arg + 0x48);
  *(float *)((long)arg + 0x68) =
       ((float)*(int *)((long)arg + 0x48) * 1e+06) / (float)*(long *)((long)arg + 0x70);
  *(long *)((long)arg + 0x78) = *(long *)((long)arg + 0x58) - *(long *)((long)arg + 0x50);
  _mpp_log_l((double)*(float *)((long)arg + 0x68),4,"mpi_dec_test",
             "decode %d frames time %lld ms delay %3d ms fps %3.2f\n",0,
             *(undefined4 *)((long)arg + 0x48),*(long *)((long)arg + 0x70) / 1000,
             (int)(*(long *)((long)arg + 0x78) / 1000));
  if (*(long *)((long)arg + 0x90) != 0) {
    mpp_osal_free("thread_decode",*(undefined8 *)((long)arg + 0x90));
  }
  *(undefined8 *)((long)arg + 0x90) = 0;
  if (*(long *)((long)arg + 0xa8) != 0) {
    mpp_osal_free("thread_decode",*(undefined8 *)((long)arg + 0xa8));
  }
  *(undefined8 *)((long)arg + 0xa8) = 0;
  return (void *)0x0;
}

Assistant:

void *thread_decode(void *arg)
{
    MpiDecLoopData *data = (MpiDecLoopData *)arg;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    RK_S64 t_s, t_e;

    memset(&data->checkcrc, 0, sizeof(data->checkcrc));
    data->checkcrc.luma.sum = mpp_malloc(RK_ULONG, 512);
    data->checkcrc.chroma.sum = mpp_malloc(RK_ULONG, 512);

    t_s = mpp_time();

    if (cmd->simple) {
        while (!data->loop_end)
            dec_simple(data);
    } else {
        /* NOTE: change output format before jpeg decoding */
        if (MPP_FRAME_FMT_IS_YUV(cmd->format) || MPP_FRAME_FMT_IS_RGB(cmd->format)) {
            MPP_RET ret = mpi->control(ctx, MPP_DEC_SET_OUTPUT_FORMAT, &cmd->format);
            if (ret) {
                mpp_err("Failed to set output format 0x%x\n", cmd->format);
                return NULL;
            }
        }

        while (!data->loop_end)
            dec_advanced(data);
    }

    t_e = mpp_time();
    data->elapsed_time = t_e - t_s;
    data->frame_count = data->frame_count;
    data->frame_rate = (float)data->frame_count * 1000000 / data->elapsed_time;
    data->delay = data->first_frm - data->first_pkt;

    mpp_log("decode %d frames time %lld ms delay %3d ms fps %3.2f\n",
            data->frame_count, (RK_S64)(data->elapsed_time / 1000),
            (RK_S32)(data->delay / 1000), data->frame_rate);

    MPP_FREE(data->checkcrc.luma.sum);
    MPP_FREE(data->checkcrc.chroma.sum);

    return NULL;
}